

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

MppTrieInfo * mpp_trie_get_info(MppTrie trie,char *name)

{
  MppTrieNode *pMVar1;
  MppTrieNode *node;
  MppTrieImpl *p;
  char *name_local;
  MppTrie trie_local;
  
  if ((trie == (MppTrie)0x0) || (name == (char *)0x0)) {
    _mpp_log_l(2,"mpp_trie","invalid trie %p name %p\n","mpp_trie_get_info",trie,name);
    trie_local = (MppTrie)0x0;
  }
  else {
    pMVar1 = mpp_trie_get_node(*(MppTrieNode **)((long)trie + 0x30),name);
    if ((pMVar1 == (MppTrieNode *)0x0) || (pMVar1->id < 0)) {
      trie_local = (MppTrie)0x0;
    }
    else {
      trie_local = (MppTrie)(*(long *)((long)trie + 0x30) + (long)pMVar1->id);
    }
  }
  return (MppTrieInfo *)trie_local;
}

Assistant:

MppTrieInfo *mpp_trie_get_info(MppTrie trie, const char *name)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    MppTrieNode *node;

    if (!trie || !name) {
        mpp_err_f("invalid trie %p name %p\n", trie, name);
        return NULL;
    }

    node = mpp_trie_get_node(p->nodes, name);
    if (!node || node->id < 0)
        return NULL;

    return (MppTrieInfo *)(((char *)p->nodes) + node->id);
}